

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O1

Vector<double,_2> __thiscall
tcu::faceForward<double,2>
          (tcu *this,Vector<double,_2> *n,Vector<double,_2> *i,Vector<double,_2> *ref)

{
  double dVar1;
  double dVar2;
  Vector<double,_2> *res_1;
  long lVar3;
  double res;
  Vector<double,_2> VVar4;
  Vector<double,_2> VVar5;
  
  dVar1 = 0.0;
  lVar3 = 0;
  do {
    dVar1 = dVar1 + ref->m_data[lVar3] * i->m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  if (dVar1 < 0.0) {
    dVar1 = n->m_data[0];
    dVar2 = n->m_data[1];
    *(double *)this = dVar1;
    *(double *)(this + 8) = dVar2;
    VVar4.m_data[1] = 0.0;
    VVar4.m_data[0] = dVar1;
    return (Vector<double,_2>)VVar4.m_data;
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  lVar3 = 0;
  do {
    VVar5.m_data[1] = -n->m_data[lVar3];
    *(double *)(this + lVar3 * 8) = VVar5.m_data[1];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  VVar5.m_data[0] = -0.0;
  return (Vector<double,_2>)VVar5.m_data;
}

Assistant:

inline Vector<T, Size> faceForward (const Vector<T, Size>& n, const Vector<T, Size>& i, const Vector<T, Size>& ref)
{
	return (dot(ref, i) < T(0)) ? n: -n;
}